

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cpp
# Opt level: O1

QpVector * __thiscall Basis::recomputex(QpVector *__return_storage_ptr__,Basis *this,Instance *inst)

{
  mapped_type *pmVar1;
  long lVar2;
  HVector *pHVar3;
  pointer pdVar4;
  long lVar5;
  QpVector rhs;
  HVector rhs_hvec;
  QpVector local_118;
  HVectorBase<double> local_e0;
  
  QpVector::QpVector(&local_118,inst->num_var);
  if (0 < inst->num_var) {
    lVar5 = 0;
    do {
      local_e0.size =
           (this->active_constraint_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[lVar5];
      if ((this->constraintindexinbasisfactor).super__Vector_base<int,_std::allocator<int>_>._M_impl
          .super__Vector_impl_data._M_start[local_e0.size] == -1) {
        puts("error");
      }
      pmVar1 = std::
               map<int,_BasisStatus,_std::less<int>,_std::allocator<std::pair<const_int,_BasisStatus>_>_>
               ::operator[](&this->basisstatus,&local_e0.size);
      lVar2 = (long)local_e0.size;
      if (*pmVar1 == kActiveAtLower) {
        if (local_e0.size < inst->num_con) {
          pdVar4 = (inst->con_lo).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar2;
        }
        else {
          pdVar4 = (inst->var_lo).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + (local_e0.size - inst->num_con);
        }
      }
      else if (local_e0.size < inst->num_con) {
        pdVar4 = (inst->con_up).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar2;
      }
      else {
        pdVar4 = (inst->var_up).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + (local_e0.size - inst->num_con);
      }
      local_118.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start
      [(this->constraintindexinbasisfactor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[lVar2]] = *pdVar4;
      local_118.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar5] = (int)lVar5;
      local_118.num_nz = local_118.num_nz + 1;
      lVar5 = lVar5 + 1;
    } while (lVar5 < inst->num_var);
  }
  pHVar3 = vec2hvec(this,&local_118);
  HVectorBase<double>::HVectorBase(&local_e0,pHVar3);
  HFactor::btranCall(&this->basisfactor,&local_e0,1.0,(HighsTimerClock *)0x0);
  hvec2vec(__return_storage_ptr__,this,&local_e0);
  if (local_e0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_e0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_118.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_118.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_118.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

QpVector Basis::recomputex(const Instance& inst) {
  assert((HighsInt)active_constraint_index.size() == inst.num_var);
  QpVector rhs(inst.num_var);

  for (HighsInt i = 0; i < inst.num_var; i++) {
    HighsInt con = active_constraint_index[i];
    if (constraintindexinbasisfactor[con] == -1) {
      printf("error\n");
    }
    if (basisstatus[con] == BasisStatus::kActiveAtLower) {
      if (con < inst.num_con) {
        rhs.value[constraintindexinbasisfactor[con]] = inst.con_lo[con];
      } else {
        rhs.value[constraintindexinbasisfactor[con]] =
            inst.var_lo[con - inst.num_con];
      }
    } else {
      if (con < inst.num_con) {
        rhs.value[constraintindexinbasisfactor[con]] = inst.con_up[con];
        // rhs.value[i] = inst.con_up[con];
      } else {
        rhs.value[constraintindexinbasisfactor[con]] =
            inst.var_up[con - inst.num_con];
        // rhs.value[i] = inst.var_up[con - inst.num_con];
      }
    }

    rhs.index[i] = i;
    rhs.num_nz++;
  }
  HVector rhs_hvec = vec2hvec(rhs);
  basisfactor.btranCall(rhs_hvec, 1.0);
  return hvec2vec(rhs_hvec);
}